

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3IncrmergeWriter(Fts3Table *p,sqlite3_int64 iAbsLevel,int iIdx,Fts3MultiSegReader *pCsr,
                       IncrmergeWriter *pWriter)

{
  int iVar1;
  sqlite3_int64 sVar2;
  sqlite3_stmt *local_58;
  sqlite3_stmt *pFirstBlock;
  sqlite3_stmt *pLeafEst;
  int local_40;
  int nLeafEst;
  int i;
  int rc;
  IncrmergeWriter *pWriter_local;
  Fts3MultiSegReader *pCsr_local;
  sqlite3_int64 sStack_20;
  int iIdx_local;
  sqlite3_int64 iAbsLevel_local;
  Fts3Table *p_local;
  
  pLeafEst._4_4_ = 0;
  pFirstBlock = (sqlite3_stmt *)0x0;
  local_58 = (sqlite3_stmt *)0x0;
  _i = pWriter;
  pWriter_local = (IncrmergeWriter *)pCsr;
  pCsr_local._4_4_ = iIdx;
  sStack_20 = iAbsLevel;
  iAbsLevel_local = (sqlite3_int64)p;
  nLeafEst = fts3SqlStmt(p,0x1d,&pFirstBlock,(sqlite3_value **)0x0);
  if (nLeafEst == 0) {
    sqlite3_bind_int64(pFirstBlock,1,sStack_20);
    sqlite3_bind_int64(pFirstBlock,2,(long)(int)pWriter_local->iAbsLevel);
    iVar1 = sqlite3_step(pFirstBlock);
    if (iVar1 == 100) {
      pLeafEst._4_4_ = sqlite3_column_int(pFirstBlock,0);
    }
    nLeafEst = sqlite3_reset(pFirstBlock);
  }
  if (nLeafEst == 0) {
    nLeafEst = fts3SqlStmt((Fts3Table *)iAbsLevel_local,10,&local_58,(sqlite3_value **)0x0);
    if (nLeafEst == 0) {
      iVar1 = sqlite3_step(local_58);
      if (iVar1 == 100) {
        sVar2 = sqlite3_column_int64(local_58,0);
        _i->iStart = sVar2;
        _i->iEnd = _i->iStart + -1;
        _i->iEnd = (long)(pLeafEst._4_4_ << 4) + _i->iEnd;
      }
      nLeafEst = sqlite3_reset(local_58);
    }
    if (nLeafEst == 0) {
      p_local._4_4_ = fts3WriteSegment((Fts3Table *)iAbsLevel_local,_i->iEnd,(char *)0x0,0);
      if (p_local._4_4_ == 0) {
        _i->iAbsLevel = sStack_20;
        _i->nLeafEst = pLeafEst._4_4_;
        _i->iIdx = pCsr_local._4_4_;
        for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
          _i->aNodeWriter[local_40].iBlock = _i->iStart + (long)(local_40 * _i->nLeafEst);
        }
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = nLeafEst;
    }
  }
  else {
    p_local._4_4_ = nLeafEst;
  }
  return p_local._4_4_;
}

Assistant:

static int fts3IncrmergeWriter( 
  Fts3Table *p,                   /* Fts3 table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level of input segments */
  int iIdx,                       /* Index of new output segment */
  Fts3MultiSegReader *pCsr,       /* Cursor that data will be read from */
  IncrmergeWriter *pWriter        /* Populate this object */
){
  int rc;                         /* Return Code */
  int i;                          /* Iterator variable */
  int nLeafEst = 0;               /* Blocks allocated for leaf nodes */
  sqlite3_stmt *pLeafEst = 0;     /* SQL used to determine nLeafEst */
  sqlite3_stmt *pFirstBlock = 0;  /* SQL used to determine first block */

  /* Calculate nLeafEst. */
  rc = fts3SqlStmt(p, SQL_MAX_LEAF_NODE_ESTIMATE, &pLeafEst, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pLeafEst, 1, iAbsLevel);
    sqlite3_bind_int64(pLeafEst, 2, pCsr->nSegment);
    if( SQLITE_ROW==sqlite3_step(pLeafEst) ){
      nLeafEst = sqlite3_column_int(pLeafEst, 0);
    }
    rc = sqlite3_reset(pLeafEst);
  }
  if( rc!=SQLITE_OK ) return rc;

  /* Calculate the first block to use in the output segment */
  rc = fts3SqlStmt(p, SQL_NEXT_SEGMENTS_ID, &pFirstBlock, 0);
  if( rc==SQLITE_OK ){
    if( SQLITE_ROW==sqlite3_step(pFirstBlock) ){
      pWriter->iStart = sqlite3_column_int64(pFirstBlock, 0);
      pWriter->iEnd = pWriter->iStart - 1;
      pWriter->iEnd += nLeafEst * FTS_MAX_APPENDABLE_HEIGHT;
    }
    rc = sqlite3_reset(pFirstBlock);
  }
  if( rc!=SQLITE_OK ) return rc;

  /* Insert the marker in the %_segments table to make sure nobody tries
  ** to steal the space just allocated. This is also used to identify 
  ** appendable segments.  */
  rc = fts3WriteSegment(p, pWriter->iEnd, 0, 0);
  if( rc!=SQLITE_OK ) return rc;

  pWriter->iAbsLevel = iAbsLevel;
  pWriter->nLeafEst = nLeafEst;
  pWriter->iIdx = iIdx;

  /* Set up the array of NodeWriter objects */
  for(i=0; i<FTS_MAX_APPENDABLE_HEIGHT; i++){
    pWriter->aNodeWriter[i].iBlock = pWriter->iStart + i*pWriter->nLeafEst;
  }
  return SQLITE_OK;
}